

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array_Data_Types.cc
# Opt level: O2

int __thiscall Array_Data_Symbol::array_allocation(Array_Data_Symbol *this,uint32_t symbol_len)

{
  pointer pVVar1;
  long lVar2;
  int i;
  ulong uVar3;
  
  this->_sym_len = symbol_len;
  this->sym_len = symbol_len;
  std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::resize
            (&this->symbol,(ulong)this->_L);
  lVar2 = 0;
  for (uVar3 = 0;
      pVVar1 = (this->symbol).super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->symbol).
                            super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 5);
      uVar3 = uVar3 + 1) {
    Vector_Data_DEF::allocate_size
              ((Vector_Data_DEF *)
               ((long)&(pVVar1->s).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl + lVar2),this->_sym_len);
    lVar2 = lVar2 + 0x20;
  }
  return 0;
}

Assistant:

int Array_Data_Symbol::array_allocation(uint32_t symbol_len)
{
	//std::vector< std::vector<uint8_t> > tmp;
	_sym_len = symbol_len;
	sym_len = _sym_len;

	//symbol.resize(_L);

	symbol.resize(_L);

	//symbol[0].allocate_size(symbol_len);
	for (int i = 0; i < symbol.size(); i++)
	{
		symbol[i].allocate_size(_sym_len);
	}

//	std::cout << "IS Numbers : " << symbol.size() << std::endl;

	//symbol_pointer = new class Vector_Data_DEF(symbol_len);


	return 0;
}